

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_nmi(Pipeline *__return_storage_ptr__,Mos6502 *this)

{
  anon_class_8_1_8991fb9c local_120;
  StepT local_118;
  anon_class_8_1_8991fb9c local_f8;
  StepT local_f0;
  anon_class_8_1_8991fb9c local_d0;
  StepT local_c8;
  anon_class_8_1_8991fb9c local_a8;
  StepT local_a0;
  anon_class_8_1_8991fb9c local_80;
  StepT local_78;
  anon_class_8_1_8991fb9c local_48;
  StepT local_40;
  undefined1 local_19;
  Mos6502 *local_18;
  Mos6502 *this_local;
  Pipeline *result;
  
  local_18 = this;
  this_local = (Mos6502 *)__return_storage_ptr__;
  (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)this->registers_->pc);
  local_19 = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  local_48.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__0,void>
            ((function<void()> *)&local_40,&local_48);
  Pipeline::push(__return_storage_ptr__,&local_40);
  std::function<void_()>::~function(&local_40);
  local_80.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__1,void>
            ((function<void()> *)&local_78,&local_80);
  Pipeline::push(__return_storage_ptr__,&local_78);
  std::function<void_()>::~function(&local_78);
  local_a8.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__2,void>
            ((function<void()> *)&local_a0,&local_a8);
  Pipeline::push(__return_storage_ptr__,&local_a0);
  std::function<void_()>::~function(&local_a0);
  local_d0.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__3,void>
            ((function<void()> *)&local_c8,&local_d0);
  Pipeline::push(__return_storage_ptr__,&local_c8);
  std::function<void_()>::~function(&local_c8);
  local_f8.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__4,void>
            ((function<void()> *)&local_f0,&local_f8);
  Pipeline::push(__return_storage_ptr__,&local_f0);
  std::function<void_()>::~function(&local_f0);
  local_120.this = this;
  std::function<void()>::function<n_e_s::core::Mos6502::create_nmi()::__5,void>
            ((function<void()> *)&local_118,&local_120);
  Pipeline::push(__return_storage_ptr__,&local_118);
  std::function<void_()>::~function(&local_118);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_nmi() {
    // Dummy read
    mmu_->read_byte(registers_->pc);
    Pipeline result;

    result.push([this] {
        // Dummy read
        mmu_->read_byte(registers_->pc);
    });
    result.push([this] {
        stack_.push_byte(static_cast<uint8_t>(registers_->pc >> 8u));
    });
    result.push([this] {
        stack_.push_byte(static_cast<uint8_t>(registers_->pc & 0xFFu));
    });
    result.push([this] { stack_.push_byte(registers_->p); });
    result.push([this] { tmp_ = mmu_->read_byte(0xFFFA); });
    result.push([this] {
        const uint16_t pch = mmu_->read_byte(0xFFFB) << 8u;
        registers_->pc = pch | tmp_;
    });

    return result;
}